

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGValidStatePtr xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlNodePtr node)

{
  _xmlAttr *p_Var1;
  xmlAttrPtr *tmp;
  xmlNodePtr root;
  int nbAttrs;
  xmlAttrPtr attrs [20];
  xmlAttrPtr local_30;
  xmlAttrPtr attr;
  xmlRelaxNGValidStatePtr ret;
  xmlNodePtr node_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  root._4_4_ = 0;
  tmp = (xmlAttrPtr *)0x0;
  if (node == (xmlNodePtr)0x0) {
    tmp = (xmlAttrPtr *)xmlDocGetRootElement(ctxt->doc);
    if ((xmlNodePtr)tmp == (xmlNodePtr)0x0) {
      return (xmlRelaxNGValidStatePtr)0x0;
    }
  }
  else {
    for (local_30 = node->properties; local_30 != (xmlAttrPtr)0x0; local_30 = local_30->next) {
      if (root._4_4_ < 0x14) {
        attrs[(long)root._4_4_ + -1] = local_30;
      }
      root._4_4_ = root._4_4_ + 1;
    }
  }
  if ((ctxt->freeState == (xmlRelaxNGStatesPtr)0x0) || (ctxt->freeState->nbState < 1)) {
    attr = (xmlAttrPtr)(*xmlMalloc)(0x38);
    if (attr == (xmlAttrPtr)0x0) {
      xmlRngVErrMemory(ctxt);
      return (xmlRelaxNGValidStatePtr)0x0;
    }
    memset(attr,0,0x38);
  }
  else {
    ctxt->freeState->nbState = ctxt->freeState->nbState + -1;
    attr = (xmlAttrPtr)ctxt->freeState->tabState[ctxt->freeState->nbState];
  }
  attr->last = (_xmlNode *)0x0;
  attr->parent = (_xmlNode *)0x0;
  if (node == (xmlNodePtr)0x0) {
    attr->_private = ctxt->doc;
    *(xmlAttrPtr **)&attr->type = tmp;
  }
  else {
    attr->_private = node;
    *(_xmlNode **)&attr->type = node->children;
  }
  *(undefined4 *)&attr->name = 0;
  if (0 < root._4_4_) {
    if (attr->next == (_xmlAttr *)0x0) {
      if (root._4_4_ < 4) {
        *(undefined4 *)((long)&attr->name + 4) = 4;
      }
      else {
        *(int *)((long)&attr->name + 4) = root._4_4_;
      }
      p_Var1 = (_xmlAttr *)(*xmlMalloc)((long)*(int *)((long)&attr->name + 4) << 3);
      attr->next = p_Var1;
      if (attr->next == (_xmlAttr *)0x0) {
        xmlRngVErrMemory(ctxt);
        return (xmlRelaxNGValidStatePtr)attr;
      }
    }
    else if (*(int *)((long)&attr->name + 4) < root._4_4_) {
      p_Var1 = (_xmlAttr *)(*xmlRealloc)(attr->next,(long)root._4_4_ << 3);
      if (p_Var1 == (_xmlAttr *)0x0) {
        xmlRngVErrMemory(ctxt);
        return (xmlRelaxNGValidStatePtr)attr;
      }
      attr->next = p_Var1;
      *(int *)((long)&attr->name + 4) = root._4_4_;
    }
    *(int *)&attr->name = root._4_4_;
    if (root._4_4_ < 0x14) {
      memcpy(attr->next,&stack0xffffffffffffff28,(long)root._4_4_ << 3);
    }
    else {
      local_30 = node->properties;
      root._4_4_ = 0;
      for (; local_30 != (_xmlAttr *)0x0; local_30 = local_30->next) {
        (&attr->next->_private)[root._4_4_] = local_30;
        root._4_4_ = root._4_4_ + 1;
      }
    }
  }
  *(undefined4 *)&attr->children = *(undefined4 *)&attr->name;
  return (xmlRelaxNGValidStatePtr)attr;
}

Assistant:

static xmlRelaxNGValidStatePtr
xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGValidStatePtr ret;
    xmlAttrPtr attr;
    xmlAttrPtr attrs[MAX_ATTR];
    int nbAttrs = 0;
    xmlNodePtr root = NULL;

    if (node == NULL) {
        root = xmlDocGetRootElement(ctxt->doc);
        if (root == NULL)
            return (NULL);
    } else {
        attr = node->properties;
        while (attr != NULL) {
            if (nbAttrs < MAX_ATTR)
                attrs[nbAttrs++] = attr;
            else
                nbAttrs++;
            attr = attr->next;
        }
    }
    if ((ctxt->freeState != NULL) && (ctxt->freeState->nbState > 0)) {
        ctxt->freeState->nbState--;
        ret = ctxt->freeState->tabState[ctxt->freeState->nbState];
    } else {
        ret =
            (xmlRelaxNGValidStatePtr)
            xmlMalloc(sizeof(xmlRelaxNGValidState));
        if (ret == NULL) {
            xmlRngVErrMemory(ctxt);
            return (NULL);
        }
        memset(ret, 0, sizeof(xmlRelaxNGValidState));
    }
    ret->value = NULL;
    ret->endvalue = NULL;
    if (node == NULL) {
        ret->node = (xmlNodePtr) ctxt->doc;
        ret->seq = root;
    } else {
        ret->node = node;
        ret->seq = node->children;
    }
    ret->nbAttrs = 0;
    if (nbAttrs > 0) {
        if (ret->attrs == NULL) {
            if (nbAttrs < 4)
                ret->maxAttrs = 4;
            else
                ret->maxAttrs = nbAttrs;
            ret->attrs = (xmlAttrPtr *) xmlMalloc(ret->maxAttrs *
                                                  sizeof(xmlAttrPtr));
            if (ret->attrs == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
        } else if (ret->maxAttrs < nbAttrs) {
            xmlAttrPtr *tmp;

            tmp = (xmlAttrPtr *) xmlRealloc(ret->attrs, nbAttrs *
                                            sizeof(xmlAttrPtr));
            if (tmp == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
            ret->attrs = tmp;
            ret->maxAttrs = nbAttrs;
        }
        ret->nbAttrs = nbAttrs;
        if (nbAttrs < MAX_ATTR) {
            memcpy(ret->attrs, attrs, sizeof(xmlAttrPtr) * nbAttrs);
        } else {
            attr = node->properties;
            nbAttrs = 0;
            while (attr != NULL) {
                ret->attrs[nbAttrs++] = attr;
                attr = attr->next;
            }
        }
    }
    ret->nbAttrLeft = ret->nbAttrs;
    return (ret);
}